

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias.cpp
# Opt level: O0

int __thiscall ncnn::Bias::forward_inplace(Bias *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float *pfVar2;
  long in_RSI;
  long in_RDI;
  int i;
  float bias;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff68;
  int local_84;
  Mat local_70;
  Mat *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x24);
  local_20 = *(int *)(in_RSI + 0x28);
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = local_1c * local_20;
  for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
    this_00 = &local_70;
    Mat::channel(in_stack_ffffffffffffff68,(int)((ulong)this_00 >> 0x20));
    in_stack_ffffffffffffff68 = (Mat *)Mat::operator_cast_to_float_(this_00);
    Mat::~Mat((Mat *)0x111007);
    local_38 = in_stack_ffffffffffffff68;
    pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x88),local_2c);
    fVar1 = *pfVar2;
    for (local_84 = 0; local_84 < local_28; local_84 = local_84 + 1) {
      *(float *)((long)&local_38->data + (long)local_84 * 4) =
           fVar1 + *(float *)((long)&local_38->data + (long)local_84 * 4);
    }
  }
  return 0;
}

Assistant:

int Bias::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_data[q];

        for (int i=0; i<size; i++)
        {
            ptr[i] += bias;
        }
    }

    return 0;
}